

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O2

uint32_t __thiscall doublechecked::Roaring::minimum(Roaring *this)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  
  _Var1 = roaring::Roaring::minimum(&this->plain);
  if ((this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    _Var2 = ~_S_red;
  }
  else {
    _Var2 = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
  }
  _assert_true((ulong)(_Var1 == _Var2),"check.empty() ? ans == UINT32_MAX : ans == *check.begin()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
               ,0xa7);
  return _Var1;
}

Assistant:

uint32_t minimum() const {
        uint32_t ans = plain.minimum();
        assert_true(check.empty() ? ans == UINT32_MAX : ans == *check.begin());
        return ans;
    }